

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O3

bool do_copy_propagation_elements(exec_list *instructions)

{
  undefined1 uVar1;
  copy_propagation_state *mem_ctx;
  ir_copy_propagation_elements_visitor v;
  ir_hierarchical_visitor local_80;
  copy_propagation_state *local_48;
  long *local_40;
  undefined2 local_38;
  copy_propagation_state *local_30;
  void *local_28;
  undefined8 local_20;
  
  ir_hierarchical_visitor::ir_hierarchical_visitor(&local_80);
  local_80._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_002584f8;
  local_38 = 0;
  local_30 = (copy_propagation_state *)ralloc_context((void *)0x0);
  local_28 = linear_alloc_parent(local_30,0);
  local_20 = 0;
  mem_ctx = local_30;
  local_40 = (long *)exec_list::operator_new(0x20,local_30);
  *local_40 = (long)(local_40 + 2);
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = (long)local_40;
  local_48 = anon_unknown.dwarf_905aa::copy_propagation_state::create(local_30,mem_ctx);
  visit_list_elements(&local_80,instructions,true);
  uVar1 = (undefined1)local_38;
  local_80._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_002584f8;
  ralloc_free(local_30);
  return (bool)uVar1;
}

Assistant:

bool
do_copy_propagation_elements(exec_list *instructions)
{
   ir_copy_propagation_elements_visitor v;

   visit_list_elements(&v, instructions);

   return v.progress;
}